

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  uint uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  char *pcVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  undefined1 auVar8 [16];
  undefined4 uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  size_t *psVar13;
  long lVar14;
  long lVar15;
  size_t sVar16;
  int iVar17;
  long lVar18;
  float fVar19;
  undefined1 auVar21 [16];
  float fVar20;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar31;
  undefined1 auVar30 [16];
  float fVar33;
  float fVar34;
  undefined1 auVar32 [16];
  float fVar35;
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  float fVar43;
  float fVar44;
  undefined1 auVar42 [16];
  float fVar45;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  size_t local_1e8;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  size_t local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  ulong local_120;
  anon_class_16_2_07cfa4d6 local_118;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_108;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e8;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  local_178._8_4_ = 0x7f800000;
  local_178._0_8_ = 0x7f8000007f800000;
  local_178._12_4_ = 0x7f800000;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  local_188._8_4_ = 0xff800000;
  local_188._0_8_ = 0xff800000ff800000;
  local_188._12_4_ = 0xff800000;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  auVar21._8_8_ = 0;
  auVar21._0_4_ =
       (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
       super_Geometry.time_range.lower;
  auVar21._4_4_ =
       (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
       super_Geometry.time_range.upper;
  auVar24._8_8_ = 0;
  auVar24._0_4_ = time_range->lower;
  auVar24._4_4_ = time_range->upper;
  auVar22 = vcmpps_avx(auVar21,auVar24,1);
  auVar29 = vinsertps_avx(auVar24,auVar21,0x50);
  auVar21 = vinsertps_avx(auVar21,auVar24,0x50);
  local_b8 = vblendvps_avx(auVar21,auVar29,auVar22);
  auVar36 = ZEXT1664(local_b8);
  local_c8 = vmovshdup_avx(local_b8);
  auVar37 = ZEXT1664(local_c8);
  if (local_b8._0_4_ <= local_c8._0_4_) {
    uVar11 = r->_begin;
    if (uVar11 < r->_end) {
      local_1e8 = 0;
      auVar38 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar39 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
      auVar40 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
      auVar41 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
      local_1a8._8_4_ = 0x7f800000;
      local_1a8._0_8_ = 0x7f8000007f800000;
      local_1a8._12_4_ = 0x7f800000;
      local_178._8_4_ = 0x7f800000;
      local_178._0_8_ = 0x7f8000007f800000;
      local_178._12_4_ = 0x7f800000;
      local_198._8_4_ = 0xff800000;
      local_198._0_8_ = 0xff800000ff800000;
      local_198._12_4_ = 0xff800000;
      local_188._8_4_ = 0xff800000;
      local_188._0_8_ = 0xff800000ff800000;
      local_188._12_4_ = 0xff800000;
      local_1b0 = k;
      do {
        BVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        auVar22._8_8_ = 0;
        auVar22._0_4_ = BVar2.lower;
        auVar22._4_4_ = BVar2.upper;
        auVar22 = vmovshdup_avx(auVar22);
        fVar19 = BVar2.lower;
        fVar25 = auVar36._0_4_ - fVar19;
        fVar31 = auVar22._0_4_ - fVar19;
        uVar3 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                    super_CurveGeometry.super_Geometry.field_0x58 +
                         *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                   super_CurveGeometry.field_0x68 * uVar11);
        pBVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 vertices.items;
        if ((ulong)(uVar3 + 3) < (pBVar4->super_RawBufferView).num) {
          fVar1 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry
                  .super_Geometry.fnumTimeSegments;
          auVar29 = ZEXT416((uint)(fVar1 * (fVar25 / fVar31) * 1.0000002));
          auVar29 = vroundss_avx(auVar29,auVar29,9);
          auVar29 = vmaxss_avx(auVar38._0_16_,auVar29);
          auVar21 = ZEXT416((uint)(fVar1 * ((auVar37._0_4_ - fVar19) / fVar31) * 0.99999976));
          auVar21 = vroundss_avx(auVar21,auVar21,10);
          auVar21 = vminss_avx(auVar21,ZEXT416((uint)fVar1));
          if ((uint)(int)auVar29._0_4_ <= (uint)(int)auVar21._0_4_) {
            uVar10 = (ulong)(int)auVar29._0_4_;
            psVar13 = &pBVar4[uVar10].super_RawBufferView.stride;
            do {
              pcVar5 = ((RawBufferView *)(psVar13 + -2))->ptr_ofs;
              sVar16 = *psVar13;
              lVar15 = sVar16 * (uVar3 + 1);
              lVar18 = sVar16 * (uVar3 + 2);
              lVar14 = sVar16 * (uVar3 + 3);
              auVar29 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + sVar16 * uVar3 + 0xc)),
                                      ZEXT416(*(uint *)(pcVar5 + lVar15 + 0xc)),0x10);
              auVar29 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(pcVar5 + lVar18 + 0xc)),0x20);
              auVar29 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(pcVar5 + lVar14 + 0xc)),0x30);
              auVar29 = vandps_avx(auVar39._0_16_,auVar29);
              auVar24 = auVar40._0_16_;
              auVar29 = vcmpps_avx(auVar29,auVar24,5);
              if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar29[0xf] < '\0') goto LAB_0123e433;
              auVar30 = auVar41._0_16_;
              auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + sVar16 * uVar3),auVar30,6);
              auVar27 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + sVar16 * uVar3),auVar24,1);
              auVar29 = vandps_avx(auVar29,auVar27);
              uVar9 = vmovmskps_avx(auVar29);
              if ((~(byte)uVar9 & 7) != 0) goto LAB_0123e433;
              auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar15),auVar30,6);
              auVar27 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar15),auVar24,1);
              auVar29 = vandps_avx(auVar29,auVar27);
              uVar9 = vmovmskps_avx(auVar29);
              if ((~(byte)uVar9 & 7) != 0) goto LAB_0123e433;
              auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar18),auVar30,6);
              auVar27 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar18),auVar24,1);
              auVar29 = vandps_avx(auVar29,auVar27);
              uVar9 = vmovmskps_avx(auVar29);
              if ((~(byte)uVar9 & 7) != 0) goto LAB_0123e433;
              auVar29 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar14),auVar30,6);
              auVar24 = vcmpps_avx(*(undefined1 (*) [16])(pcVar5 + lVar14),auVar24,1);
              auVar29 = vandps_avx(auVar29,auVar24);
              uVar9 = vmovmskps_avx(auVar29);
              if ((~(byte)uVar9 & 7) != 0) goto LAB_0123e433;
              uVar10 = uVar10 + 1;
              psVar13 = psVar13 + 7;
            } while (uVar10 <= (ulong)(long)(int)auVar21._0_4_);
          }
          fVar20 = auVar22._0_4_ - fVar19;
          fVar25 = fVar25 / fVar20;
          fVar20 = (auVar37._0_4_ - fVar19) / fVar20;
          fVar31 = fVar1 * fVar25;
          fVar19 = fVar1 * fVar20;
          auVar21 = vroundss_avx(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31),9);
          auVar24 = vroundss_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19),10);
          auVar22 = vmaxss_avx(auVar21,auVar38._0_16_);
          auVar29 = vminss_avx(auVar24,ZEXT416((uint)fVar1));
          iVar12 = (int)auVar22._0_4_;
          fVar26 = auVar29._0_4_;
          local_118.primID = &local_120;
          uVar3 = (int)auVar21._0_4_;
          if ((int)auVar21._0_4_ < 0) {
            uVar3 = 0xffffffff;
          }
          iVar17 = (int)fVar1 + 1;
          if ((int)auVar24._0_4_ < (int)fVar1 + 1) {
            iVar17 = (int)auVar24._0_4_;
          }
          local_120 = uVar11;
          local_118.this =
               (CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
                *)this;
          ::anon_func::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_e8.field_1,&local_118,(long)iVar12);
          ::anon_func::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_108.field_1,&local_118,(long)(int)fVar26);
          fVar31 = fVar31 - auVar22._0_4_;
          if (iVar17 - uVar3 == 1) {
            auVar22 = vmaxss_avx(ZEXT416((uint)fVar31),ZEXT816(0) << 0x40);
            auVar29 = vshufps_avx(auVar22,auVar22,0);
            auVar22 = ZEXT416((uint)(1.0 - auVar22._0_4_));
            auVar22 = vshufps_avx(auVar22,auVar22,0);
            auVar42._0_4_ = auVar29._0_4_ * local_108.m128[0] + auVar22._0_4_ * local_e8.m128[0];
            auVar42._4_4_ = auVar29._4_4_ * local_108.m128[1] + auVar22._4_4_ * local_e8.m128[1];
            auVar42._8_4_ = auVar29._8_4_ * local_108.m128[2] + auVar22._8_4_ * local_e8.m128[2];
            auVar42._12_4_ = auVar29._12_4_ * local_108.m128[3] + auVar22._12_4_ * local_e8.m128[3];
            auVar30._0_4_ = auVar29._0_4_ * local_f8 + auVar22._0_4_ * local_d8;
            auVar30._4_4_ = auVar29._4_4_ * fStack_f4 + auVar22._4_4_ * fStack_d4;
            auVar30._8_4_ = auVar29._8_4_ * fStack_f0 + auVar22._8_4_ * fStack_d0;
            auVar30._12_4_ = auVar29._12_4_ * fStack_ec + auVar22._12_4_ * fStack_cc;
            auVar22 = vmaxss_avx(ZEXT416((uint)(fVar26 - fVar19)),ZEXT816(0) << 0x40);
            auVar29 = vshufps_avx(auVar22,auVar22,0);
            auVar22 = ZEXT416((uint)(1.0 - auVar22._0_4_));
            auVar22 = vshufps_avx(auVar22,auVar22,0);
            auVar27._0_4_ = auVar22._0_4_ * local_108.m128[0] + auVar29._0_4_ * local_e8.m128[0];
            auVar27._4_4_ = auVar22._4_4_ * local_108.m128[1] + auVar29._4_4_ * local_e8.m128[1];
            auVar27._8_4_ = auVar22._8_4_ * local_108.m128[2] + auVar29._8_4_ * local_e8.m128[2];
            auVar27._12_4_ = auVar22._12_4_ * local_108.m128[3] + auVar29._12_4_ * local_e8.m128[3];
            auVar32._0_4_ = auVar22._0_4_ * local_f8 + auVar29._0_4_ * local_d8;
            auVar32._4_4_ = auVar22._4_4_ * fStack_f4 + auVar29._4_4_ * fStack_d4;
            auVar32._8_4_ = auVar22._8_4_ * fStack_f0 + auVar29._8_4_ * fStack_d0;
            auVar32._12_4_ = auVar22._12_4_ * fStack_ec + auVar29._12_4_ * fStack_cc;
          }
          else {
            ::anon_func::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_58.field_1,&local_118,(long)(iVar12 + 1));
            ::anon_func::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_118,(long)((int)fVar26 + -1));
            auVar22 = vmaxss_avx(ZEXT416((uint)fVar31),ZEXT816(0) << 0x40);
            auVar29 = vshufps_avx(auVar22,auVar22,0);
            auVar22 = ZEXT416((uint)(1.0 - auVar22._0_4_));
            auVar22 = vshufps_avx(auVar22,auVar22,0);
            auVar42._0_4_ = auVar29._0_4_ * local_58.m128[0] + auVar22._0_4_ * local_e8.m128[0];
            auVar42._4_4_ = auVar29._4_4_ * local_58.m128[1] + auVar22._4_4_ * local_e8.m128[1];
            auVar42._8_4_ = auVar29._8_4_ * local_58.m128[2] + auVar22._8_4_ * local_e8.m128[2];
            auVar42._12_4_ = auVar29._12_4_ * local_58.m128[3] + auVar22._12_4_ * local_e8.m128[3];
            auVar30._0_4_ = auVar29._0_4_ * local_48 + auVar22._0_4_ * local_d8;
            auVar30._4_4_ = auVar29._4_4_ * fStack_44 + auVar22._4_4_ * fStack_d4;
            auVar30._8_4_ = auVar29._8_4_ * fStack_40 + auVar22._8_4_ * fStack_d0;
            auVar30._12_4_ = auVar29._12_4_ * fStack_3c + auVar22._12_4_ * fStack_cc;
            auVar22 = vmaxss_avx(ZEXT416((uint)(fVar26 - fVar19)),ZEXT816(0) << 0x40);
            auVar29 = vshufps_avx(auVar22,auVar22,0);
            auVar22 = ZEXT416((uint)(1.0 - auVar22._0_4_));
            auVar22 = vshufps_avx(auVar22,auVar22,0);
            auVar27._0_4_ = auVar29._0_4_ * local_78.m128[0] + auVar22._0_4_ * local_108.m128[0];
            auVar27._4_4_ = auVar29._4_4_ * local_78.m128[1] + auVar22._4_4_ * local_108.m128[1];
            auVar27._8_4_ = auVar29._8_4_ * local_78.m128[2] + auVar22._8_4_ * local_108.m128[2];
            auVar27._12_4_ = auVar29._12_4_ * local_78.m128[3] + auVar22._12_4_ * local_108.m128[3];
            auVar32._0_4_ = auVar29._0_4_ * local_68 + auVar22._0_4_ * local_f8;
            auVar32._4_4_ = auVar29._4_4_ * fStack_64 + auVar22._4_4_ * fStack_f4;
            auVar32._8_4_ = auVar29._8_4_ * fStack_60 + auVar22._8_4_ * fStack_f0;
            auVar32._12_4_ = auVar29._12_4_ * fStack_5c + auVar22._12_4_ * fStack_ec;
            if ((int)(uVar3 + 1) < iVar17) {
              sVar16 = (size_t)(uVar3 + 1);
              iVar17 = ~uVar3 + iVar17;
              do {
                auVar23._0_4_ = ((float)(int)sVar16 / fVar1 - fVar25) / (fVar20 - fVar25);
                auVar23._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar22 = vshufps_avx(auVar23,auVar23,0);
                local_1c8 = auVar27._0_4_;
                fStack_1c4 = auVar27._4_4_;
                fStack_1c0 = auVar27._8_4_;
                fStack_1bc = auVar27._12_4_;
                auVar29 = vshufps_avx(ZEXT416((uint)(1.0 - auVar23._0_4_)),
                                      ZEXT416((uint)(1.0 - auVar23._0_4_)),0);
                fVar43 = auVar42._4_4_;
                fVar44 = auVar42._8_4_;
                fVar45 = auVar42._12_4_;
                fVar33 = auVar32._4_4_;
                fVar34 = auVar32._8_4_;
                fVar35 = auVar32._12_4_;
                fVar31 = auVar30._4_4_;
                fVar19 = auVar30._8_4_;
                fVar26 = auVar30._12_4_;
                local_a8 = auVar32._0_4_ * auVar22._0_4_ + auVar30._0_4_ * auVar29._0_4_;
                fStack_a4 = fVar33 * auVar22._4_4_ + fVar31 * auVar29._4_4_;
                fStack_a0 = fVar34 * auVar22._8_4_ + fVar19 * auVar29._8_4_;
                fStack_9c = fVar35 * auVar22._12_4_ + fVar26 * auVar29._12_4_;
                ::anon_func::anon_class_16_2_07cfa4d6::operator()
                          ((BBox3fa *)&local_98.field_1,&local_118,sVar16);
                auVar8._4_4_ = auVar22._4_4_ * fStack_1c4 + fVar43 * auVar29._4_4_;
                auVar8._0_4_ = auVar22._0_4_ * local_1c8 + auVar42._0_4_ * auVar29._0_4_;
                auVar8._8_4_ = auVar22._8_4_ * fStack_1c0 + fVar44 * auVar29._8_4_;
                auVar8._12_4_ = auVar22._12_4_ * fStack_1bc + fVar45 * auVar29._12_4_;
                auVar22 = vsubps_avx((undefined1  [16])local_98,auVar8);
                auVar29._4_4_ = fStack_a4;
                auVar29._0_4_ = local_a8;
                auVar29._8_4_ = fStack_a0;
                auVar29._12_4_ = fStack_9c;
                auVar21 = vsubps_avx(local_88,auVar29);
                auVar29 = vminps_avx(auVar22,ZEXT816(0) << 0x40);
                auVar22 = vmaxps_avx(auVar21,ZEXT816(0) << 0x40);
                auVar42._0_4_ = auVar42._0_4_ + auVar29._0_4_;
                auVar42._4_4_ = fVar43 + auVar29._4_4_;
                auVar42._8_4_ = fVar44 + auVar29._8_4_;
                auVar42._12_4_ = fVar45 + auVar29._12_4_;
                auVar27._0_4_ = local_1c8 + auVar29._0_4_;
                auVar27._4_4_ = fStack_1c4 + auVar29._4_4_;
                auVar27._8_4_ = fStack_1c0 + auVar29._8_4_;
                auVar27._12_4_ = fStack_1bc + auVar29._12_4_;
                auVar30._0_4_ = auVar30._0_4_ + auVar22._0_4_;
                auVar30._4_4_ = fVar31 + auVar22._4_4_;
                auVar30._8_4_ = fVar19 + auVar22._8_4_;
                auVar30._12_4_ = fVar26 + auVar22._12_4_;
                auVar32._0_4_ = auVar32._0_4_ + auVar22._0_4_;
                auVar32._4_4_ = fVar33 + auVar22._4_4_;
                auVar32._8_4_ = fVar34 + auVar22._8_4_;
                auVar32._12_4_ = fVar35 + auVar22._12_4_;
                sVar16 = sVar16 + 1;
                iVar17 = iVar17 + -1;
              } while (iVar17 != 0);
            }
          }
          auVar38 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar22 = vcmpps_avx(auVar42,auVar30,2);
          uVar9 = vmovmskps_avx(auVar22);
          auVar36 = ZEXT1664(local_b8);
          auVar37 = ZEXT1664(local_c8);
          auVar39 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auVar40 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          auVar41 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          if ((~(byte)uVar9 & 7) == 0) {
            auVar22 = vcmpps_avx(auVar27,auVar32,2);
            uVar9 = vmovmskps_avx(auVar22);
            if ((~(byte)uVar9 & 7) == 0) {
              auVar22 = vminps_avx(auVar42,auVar27);
              aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                      vinsertps_avx(auVar22,ZEXT416(geomID),0x30);
              auVar22 = vmaxps_avx(auVar30,auVar32);
              aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                      vinsertps_avx(auVar22,ZEXT416((uint)uVar11),0x30);
              auVar28._0_4_ = aVar6.x + aVar7.x;
              auVar28._4_4_ = aVar6.y + aVar7.y;
              auVar28._8_4_ = aVar6.z + aVar7.z;
              auVar28._12_4_ = aVar6.field_3.w + aVar7.field_3.w;
              local_1a8 = vminps_avx(local_1a8,(undefined1  [16])aVar6);
              local_198 = vmaxps_avx(local_198,(undefined1  [16])aVar7);
              local_178 = vminps_avx(local_178,auVar28);
              local_188 = vmaxps_avx(local_188,auVar28);
              local_1e8 = local_1e8 + 1;
              prims[local_1b0].lower.field_0.field_1 = aVar6;
              prims[local_1b0].upper.field_0.field_1 = aVar7;
              local_1b0 = local_1b0 + 1;
            }
          }
        }
LAB_0123e433:
        uVar11 = uVar11 + 1;
      } while (uVar11 < r->_end);
    }
    else {
      local_1e8 = 0;
      local_198._8_4_ = 0xff800000;
      local_198._0_8_ = 0xff800000ff800000;
      local_198._12_4_ = 0xff800000;
      local_1a8._8_4_ = 0x7f800000;
      local_1a8._0_8_ = 0x7f8000007f800000;
      local_1a8._12_4_ = 0x7f800000;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_1a8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_1a8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_198._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_198._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_178._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_178._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_188._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_188._8_8_;
    __return_storage_ptr__->end = local_1e8;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }